

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

int N_VScaleAddMulti_Serial(int nvec,realtype *a,N_Vector x,N_Vector *Y,N_Vector *Z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  realtype *zd;
  realtype *yd;
  realtype *xd;
  sunindextype N;
  sunindextype j;
  int i;
  N_Vector *Z_local;
  N_Vector *Y_local;
  N_Vector x_local;
  realtype *a_local;
  int nvec_local;
  
  if (nvec < 1) {
    a_local._4_4_ = -1;
  }
  else if (nvec == 1) {
    N_VLinearSum_Serial(*a,x,1.0,*Y,*Z);
    a_local._4_4_ = 0;
  }
  else {
    lVar1 = *x->content;
    lVar2 = *(long *)((long)x->content + 0x10);
    if (Y == Z) {
      for (j._4_4_ = 0; j._4_4_ < nvec; j._4_4_ = j._4_4_ + 1) {
        lVar3 = *(long *)((long)Y[j._4_4_]->content + 0x10);
        for (N = 0; N < lVar1; N = N + 1) {
          *(double *)(lVar3 + N * 8) =
               a[j._4_4_] * *(double *)(lVar2 + N * 8) + *(double *)(lVar3 + N * 8);
        }
      }
      a_local._4_4_ = 0;
    }
    else {
      for (j._4_4_ = 0; j._4_4_ < nvec; j._4_4_ = j._4_4_ + 1) {
        lVar3 = *(long *)((long)Y[j._4_4_]->content + 0x10);
        lVar4 = *(long *)((long)Z[j._4_4_]->content + 0x10);
        for (N = 0; N < lVar1; N = N + 1) {
          *(double *)(lVar4 + N * 8) =
               a[j._4_4_] * *(double *)(lVar2 + N * 8) + *(double *)(lVar3 + N * 8);
        }
      }
      a_local._4_4_ = 0;
    }
  }
  return a_local._4_4_;
}

Assistant:

int N_VScaleAddMulti_Serial(int nvec, realtype* a, N_Vector x, N_Vector* Y, N_Vector* Z)
{
  int          i;
  sunindextype j, N;
  realtype*    xd=NULL;
  realtype*    yd=NULL;
  realtype*    zd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VLinearSum */
  if (nvec == 1) {
    N_VLinearSum_Serial(a[0], x, ONE, Y[0], Z[0]);
    return(0);
  }

  /* get vector length and data array */
  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  /*
   * Y[i][j] += a[i] * x[j]
   */
  if (Y == Z) {
    for (i=0; i<nvec; i++) {
      yd = NV_DATA_S(Y[i]);
      for (j=0; j<N; j++) {
        yd[j] += a[i] * xd[j];
      }
    }
    return(0);
  }

  /*
   * Z[i][j] = Y[i][j] + a[i] * x[j]
   */
  for (i=0; i<nvec; i++) {
    yd = NV_DATA_S(Y[i]);
    zd = NV_DATA_S(Z[i]);
    for (j=0; j<N; j++) {
      zd[j] = a[i] * xd[j] + yd[j];
    }
  }
  return(0);
}